

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncLogging.cpp
# Opt level: O0

void __thiscall AsyncLogging::AsyncLogging(AsyncLogging *this,string *logFileName,int flushInterval)

{
  FixedBuffer<4000000> *this_00;
  FixedBuffer<4000000> *this_01;
  size_type sVar1;
  element_type *peVar2;
  undefined4 in_EDX;
  size_t __n;
  size_t __n_00;
  Thread *in_RSI;
  void *__s;
  undefined4 *in_RDI;
  FixedBuffer<4000000> *in_stack_fffffffffffffef8;
  Condition *in_stack_ffffffffffffff00;
  _Bind<void_(AsyncLogging::*(AsyncLogging_*))()> *in_stack_ffffffffffffff08;
  function<void_()> *in_stack_ffffffffffffff10;
  int count;
  undefined4 *__n_01;
  string *in_stack_ffffffffffffff30;
  vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  ThreadFunc *func;
  ThreadFunc local_99;
  code *local_60;
  undefined8 local_58;
  
  *in_RDI = in_EDX;
  *(undefined1 *)(in_RDI + 1) = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
             in_stack_ffffffffffffff38);
  local_60 = threadFunc;
  local_58 = 0;
  std::bind<void(AsyncLogging::*)(),AsyncLogging*>
            (&in_stack_ffffffffffffff08->_M_f,(AsyncLogging **)in_stack_ffffffffffffff00);
  std::function<void()>::function<std::_Bind<void(AsyncLogging::*(AsyncLogging*))()>,void>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  func = &local_99;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
             (char *)func,(allocator<char> *)in_stack_ffffffffffffff30);
  Thread::Thread(in_RSI,func,in_stack_ffffffffffffff30);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff00);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::function<void_()>::~function((function<void_()> *)0x121e06);
  this_02 = (vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
             *)(in_RDI + 0x3c);
  MutexLock::MutexLock((MutexLock *)0x121e1c);
  __n_01 = in_RDI + 0x46;
  Condition::Condition(in_stack_ffffffffffffff00,(MutexLock *)in_stack_fffffffffffffef8);
  count = (int)((ulong)(in_RDI + 0x54) >> 0x20);
  this_00 = (FixedBuffer<4000000> *)operator_new(0x3d0908);
  FixedBuffer<4000000>::FixedBuffer(this_00);
  std::shared_ptr<FixedBuffer<4000000>>::shared_ptr<FixedBuffer<4000000>,void>
            ((shared_ptr<FixedBuffer<4000000>_> *)in_stack_ffffffffffffff00,
             in_stack_fffffffffffffef8);
  this_01 = (FixedBuffer<4000000> *)operator_new(0x3d0908);
  FixedBuffer<4000000>::FixedBuffer(this_01);
  std::shared_ptr<FixedBuffer<4000000>>::shared_ptr<FixedBuffer<4000000>,void>
            ((shared_ptr<FixedBuffer<4000000>_> *)in_stack_ffffffffffffff00,
             in_stack_fffffffffffffef8);
  *(undefined8 *)(in_RDI + 0x5c) = 0;
  *(undefined8 *)(in_RDI + 0x5e) = 0;
  *(undefined8 *)(in_RDI + 0x60) = 0;
  std::
  vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ::vector((vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
            *)0x121ee9);
  __s = (void *)0x1;
  CountDownLatch::CountDownLatch((CountDownLatch *)this_00,count);
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI);
  if (1 < sVar1) {
    peVar2 = std::
             __shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x12207e);
    FixedBuffer<4000000>::bzero(peVar2,__s,__n);
    peVar2 = std::
             __shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x122099);
    FixedBuffer<4000000>::bzero(peVar2,__s,__n_00);
    std::
    vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ::reserve(this_02,(size_type)__n_01);
    return;
  }
  __assert_fail("logFileName.size() > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/AsyncLogging.cpp"
                ,0x18,"AsyncLogging::AsyncLogging(std::string, int)");
}

Assistant:

AsyncLogging::AsyncLogging(std::string logFileName, int flushInterval)
        : flushInterval_(flushInterval),
        running_(false),
        basename_(logFileName),
        thread_(std::bind(&AsyncLogging::threadFunc, this), "Logging"),
        mutex_(),
        cond_(mutex_),
        currentBuffer_(new Buffer),
        nextBuffer_(new Buffer),
        buffers_(),
        latch_(1){
            assert(logFileName.size() > 1);
            currentBuffer_->bzero();
            nextBuffer_->bzero();
            buffers_.reserve(16);
}